

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O2

void __thiscall
BasicContainer::BasicContainer
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list)

{
  pointer ppBVar1;
  int i;
  ulong uVar2;
  AABox *a;
  AABox local_78;
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  AABox local_48;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_001aebd8;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&this->list,list);
  this->root = (treenode *)0x0;
  local_78._0_8_ =
       (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start >> 3;
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[11]>
            (&console,(char (*) [20])"building SAH BVH of",(unsigned_long *)&local_78,
             (char (*) [11])"primitives");
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_60,list);
  build(this,(vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_60,&this->root);
  std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_60);
  (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
       super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_78);
  a = &this->bound;
  (this->bound).z1 = local_78.z1;
  (this->bound).z2 = local_78.z2;
  a->x1 = local_78.x1;
  (this->bound).x2 = local_78.x2;
  (this->bound).y1 = local_78.y1;
  (this->bound).y2 = local_78.y2;
  uVar2 = 1;
  while( true ) {
    ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar2)
    break;
    (*(ppBVar1[uVar2]->super_Primitive)._vptr_Primitive[1])(&local_48);
    operator+(&local_78,a,&local_48);
    (this->bound).z1 = local_78.z1;
    (this->bound).z2 = local_78.z2;
    a->x1 = local_78.x1;
    (this->bound).x2 = local_78.x2;
    (this->bound).y1 = local_78.y1;
    (this->bound).y2 = local_78.y2;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

BasicContainer(const std::vector<BasicPrimitive*>& list): list(list)
	{
		console.log("building SAH BVH of", list.size(), "primitives");
		build(list, root);
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
	}